

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void __thiscall
LimitedStringFormatter<256UL>::Unser<DataStream>
          (LimitedStringFormatter<256UL> *this,DataStream *s,string *v)

{
  long lVar1;
  uint64_t __n;
  char *pcVar2;
  size_t in_RCX;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __n = ReadCompactSize<DataStream>(s,true);
  if (__n < 0x101) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
              (v,__n,'\0');
    if (__n == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
    }
    else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      DataStream::read(s,(int)(v->_M_dataplus)._M_p,(void *)v->_M_string_length,in_RCX);
      return;
    }
  }
  else {
    pcVar2 = (char *)__cxa_allocate_exception(0x20);
    std::iostream_category();
    std::ios_base::failure[abi:cxx11]::failure(pcVar2,(error_code *)"String length limit exceeded");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(pcVar2,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  __stack_chk_fail();
}

Assistant:

void Unser(Stream& s, std::string& v)
    {
        size_t size = ReadCompactSize(s);
        if (size > Limit) {
            throw std::ios_base::failure("String length limit exceeded");
        }
        v.resize(size);
        if (size != 0) s.read(MakeWritableByteSpan(v));
    }